

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

long unpaid_cost(obj *unp_obj)

{
  long local_28;
  monst *local_20;
  monst *shkp;
  bill_x *bp;
  obj *unp_obj_local;
  
  shkp = (monst *)0x0;
  local_20 = next_shkp(level->monlist,'\x01');
  while ((local_20 != (monst *)0x0 &&
         (shkp = (monst *)onbill(unp_obj,local_20,'\x01'), shkp == (monst *)0x0))) {
    local_20 = next_shkp(local_20->nmon,'\x01');
  }
  if (shkp == (monst *)0x0) {
    warning("unpaid_cost: object wasn\'t on any bill!");
    local_28 = 0;
  }
  else {
    local_28 = (long)(unp_obj->quan * *(int *)&shkp->data);
  }
  return local_28;
}

Assistant:

long unpaid_cost(const struct obj *unp_obj)
{
	struct bill_x *bp = NULL;
	struct monst *shkp;

	for (shkp = next_shkp(level->monlist, TRUE); shkp;
					shkp = next_shkp(shkp->nmon, TRUE))
	    if ((bp = onbill(unp_obj, shkp, TRUE)) != 0) break;

	/* onbill() gave no message if unexpected problem occurred */
	if (!bp) warning("unpaid_cost: object wasn't on any bill!");

	return bp ? unp_obj->quan * bp->price : 0L;
}